

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_HermiteSurface::IsValid(ON_HermiteSurface *this)

{
  int iVar1;
  ON_SimpleArray<ON_3dPoint> *pOVar2;
  ON_SimpleArray<ON_3dVector> *pOVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = (this->m_u_parameters).m_count;
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    bVar4 = ON_IsValid(*(this->m_u_parameters).m_a);
    if (bVar4) {
      lVar10 = 1;
      do {
        lVar7 = (long)(this->m_u_parameters).m_count;
        bVar6 = lVar10 < lVar7;
        if (lVar7 <= lVar10) goto LAB_00552e4b;
        bVar4 = ON_IsValid((this->m_u_parameters).m_a[lVar10]);
        lVar10 = lVar10 + 1;
      } while (bVar4);
    }
    if (bVar6) {
      return false;
    }
  }
LAB_00552e4b:
  iVar1 = (this->m_v_parameters).m_count;
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    bVar4 = ON_IsValid(*(this->m_v_parameters).m_a);
    if (bVar4) {
      lVar10 = 1;
      do {
        lVar7 = (long)(this->m_v_parameters).m_count;
        bVar6 = lVar10 < lVar7;
        if (lVar7 <= lVar10) goto LAB_00552e98;
        bVar4 = ON_IsValid((this->m_v_parameters).m_a[lVar10]);
        lVar10 = lVar10 + 1;
      } while (bVar4);
    }
    if (bVar6) {
      return false;
    }
  }
LAB_00552e98:
  iVar1 = (this->m_grid_points).m_count;
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      pOVar2 = (this->m_grid_points).m_a;
      iVar1 = pOVar2[lVar10].m_count;
      bVar4 = 0 < iVar1;
      if (0 < iVar1) {
        bVar5 = ON_3dPoint::IsUnset(pOVar2[lVar10].m_a);
        if (!bVar5) {
          lVar9 = 0;
          lVar7 = 0x18;
          do {
            lVar9 = lVar9 + 1;
            pOVar2 = (this->m_grid_points).m_a;
            lVar8 = (long)pOVar2[lVar10].m_count;
            bVar4 = lVar9 < lVar8;
            if (lVar8 <= lVar9) goto LAB_00552f05;
            bVar5 = ON_3dPoint::IsUnset((ON_3dPoint *)((long)&(pOVar2[lVar10].m_a)->x + lVar7));
            lVar7 = lVar7 + 0x18;
          } while (!bVar5);
        }
        if (bVar4) {
          if (bVar6) {
            return false;
          }
          break;
        }
      }
LAB_00552f05:
      lVar10 = lVar10 + 1;
      lVar7 = (long)(this->m_grid_points).m_count;
      bVar6 = lVar10 < lVar7;
    } while (lVar10 < lVar7);
  }
  iVar1 = (this->m_u_tangents).m_count;
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      pOVar3 = (this->m_u_tangents).m_a;
      iVar1 = pOVar3[lVar10].m_count;
      bVar4 = 0 < iVar1;
      if (0 < iVar1) {
        bVar5 = ON_3dVector::IsUnset(pOVar3[lVar10].m_a);
        if (!bVar5) {
          lVar9 = 0;
          lVar7 = 0x18;
          do {
            lVar9 = lVar9 + 1;
            pOVar3 = (this->m_u_tangents).m_a;
            lVar8 = (long)pOVar3[lVar10].m_count;
            bVar4 = lVar9 < lVar8;
            if (lVar8 <= lVar9) goto LAB_00552f81;
            bVar5 = ON_3dVector::IsUnset((ON_3dVector *)((long)&(pOVar3[lVar10].m_a)->x + lVar7));
            lVar7 = lVar7 + 0x18;
          } while (!bVar5);
        }
        if (bVar4) {
          if (bVar6) {
            return false;
          }
          break;
        }
      }
LAB_00552f81:
      lVar10 = lVar10 + 1;
      lVar7 = (long)(this->m_u_tangents).m_count;
      bVar6 = lVar10 < lVar7;
    } while (lVar10 < lVar7);
  }
  iVar1 = (this->m_v_tangents).m_count;
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      pOVar3 = (this->m_v_tangents).m_a;
      iVar1 = pOVar3[lVar10].m_count;
      bVar4 = 0 < iVar1;
      if (0 < iVar1) {
        bVar5 = ON_3dVector::IsUnset(pOVar3[lVar10].m_a);
        if (!bVar5) {
          lVar9 = 0;
          lVar7 = 0x18;
          do {
            lVar9 = lVar9 + 1;
            pOVar3 = (this->m_v_tangents).m_a;
            lVar8 = (long)pOVar3[lVar10].m_count;
            bVar4 = lVar9 < lVar8;
            if (lVar8 <= lVar9) goto LAB_00552ffd;
            bVar5 = ON_3dVector::IsUnset((ON_3dVector *)((long)&(pOVar3[lVar10].m_a)->x + lVar7));
            lVar7 = lVar7 + 0x18;
          } while (!bVar5);
        }
        if (bVar4) {
          if (bVar6) {
            return false;
          }
          break;
        }
      }
LAB_00552ffd:
      lVar10 = lVar10 + 1;
      lVar7 = (long)(this->m_v_tangents).m_count;
      bVar6 = lVar10 < lVar7;
    } while (lVar10 < lVar7);
  }
  iVar1 = (this->m_twists).m_count;
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      pOVar3 = (this->m_twists).m_a;
      iVar1 = pOVar3[lVar10].m_count;
      bVar4 = 0 < iVar1;
      if (0 < iVar1) {
        bVar5 = ON_3dVector::IsUnset(pOVar3[lVar10].m_a);
        if (!bVar5) {
          lVar9 = 0;
          lVar7 = 0x18;
          do {
            lVar9 = lVar9 + 1;
            pOVar3 = (this->m_twists).m_a;
            lVar8 = (long)pOVar3[lVar10].m_count;
            bVar4 = lVar9 < lVar8;
            if (lVar8 <= lVar9) goto LAB_0055307e;
            bVar5 = ON_3dVector::IsUnset((ON_3dVector *)((long)&(pOVar3[lVar10].m_a)->x + lVar7));
            lVar7 = lVar7 + 0x18;
          } while (!bVar5);
        }
        if (bVar4) {
          if (bVar6) {
            return false;
          }
          break;
        }
      }
LAB_0055307e:
      lVar10 = lVar10 + 1;
      lVar7 = (long)(this->m_twists).m_count;
      bVar6 = lVar10 < lVar7;
    } while (lVar10 < lVar7);
  }
  bVar6 = ValidateHermiteData(&this->m_u_parameters,&this->m_v_parameters,&this->m_grid_points,
                              &this->m_u_tangents,&this->m_v_tangents,&this->m_twists);
  return bVar6;
}

Assistant:

bool ON_HermiteSurface::IsValid() const
{
  for (int i = 0; i < m_u_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_u_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_v_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_v_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_grid_points.Count(); i++)
  {
    for (int j = 0; j < m_grid_points[i].Count(); j++)
    {
      if (m_grid_points[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_u_tangents.Count(); i++)
  {
    for (int j = 0; j < m_u_tangents[i].Count(); j++)
    {
      if (m_u_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_v_tangents.Count(); i++)
  {
    for (int j = 0; j < m_v_tangents[i].Count(); j++)
    {
      if (m_v_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_twists.Count(); i++)
  {
    for (int j = 0; j < m_twists[i].Count(); j++)
    {
      if (m_twists[i][j].IsUnset())
        return false;
    }
  }
  
  return ValidateHermiteData(
    UParameters(),
    VParameters(),
    GridPoints(),
    UTangents(),
    VTangents(),
    Twists()
  );
}